

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_duckdb::vector<long,_true>_&,_const_duckdb::vector<long,_true>_&> * __thiscall
Catch::ExprLhs<duckdb::vector<long,true>const&>::operator==
          (ExprLhs<const_duckdb::vector<long,_true>_&> *this,vector<long,_true> *rhs)

{
  StringRef op;
  bool comparisonResult;
  vector<long,_true> *in_RSI;
  BinaryExpr<const_duckdb::vector<long,_true>_&,_const_duckdb::vector<long,_true>_&> *in_RDI;
  vector<long,_true> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  pointer plVar1;
  BinaryExpr<const_duckdb::vector<long,_true>_&,_const_duckdb::vector<long,_true>_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareEqual<duckdb::vector<long,true>,duckdb::vector<long,true>>
                 (in_RSI,in_stack_ffffffffffffffa8);
  plVar1 = (in_RSI->super_vector<long,_std::allocator<long>_>).
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = (char *)plVar1;
  BinaryExpr<const_duckdb::vector<long,_true>_&,_const_duckdb::vector<long,_true>_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }